

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O0

void __thiscall DNSResolve::HandleEvent(DNSResolve *this,SOCKET s,int event)

{
  bool bVar1;
  int iVar2;
  Log *pLVar3;
  time_t tVar4;
  time_t now;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  reference local_4a0;
  sockaddr_in *dns_server_addr;
  iterator __end2;
  iterator __begin2;
  list<sockaddr_in,_std::allocator<sockaddr_in>_> *__range2;
  undefined1 local_478 [3];
  bool find;
  int addr_len;
  sockaddr_in addr;
  char recv_data [1024];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_18;
  SOCKET local_14;
  int event_local;
  SOCKET s_local;
  DNSResolve *this_local;
  
  local_18 = event;
  local_14 = s;
  _event_local = this;
  if (s == this->dns_socket_) {
    if ((event & 8U) == 0) {
      __range2._4_4_ = 0x10;
      BufferRecvFrom(s,(char *)addr.sin_zero,0x400,(sockaddr *)local_478,
                     (int *)((long)&__range2 + 4));
      __range2._3_1_ = 0;
      __end2 = std::__cxx11::list<sockaddr_in,_std::allocator<sockaddr_in>_>::begin(&this->servers_)
      ;
      dns_server_addr =
           (sockaddr_in *)
           std::__cxx11::list<sockaddr_in,_std::allocator<sockaddr_in>_>::end(&this->servers_);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&dns_server_addr), bVar1) {
        local_4a0 = std::_List_iterator<sockaddr_in>::operator*(&__end2);
        if (addr_len == (local_4a0->sin_addr).s_addr) {
          __range2._3_1_ = 1;
          break;
        }
        std::_List_iterator<sockaddr_in>::operator++(&__end2);
      }
      if ((__range2._3_1_ & 1) == 0) {
        pLVar3 = Log::GetInstance();
        pLVar3 = Log::operator<<(pLVar3,yellow);
        Log::FormatTime_abi_cxx11_();
        pLVar3 = Log::operator<<(pLVar3,&local_4c0);
        pLVar3 = Log::operator<<(pLVar3,(char (*) [12])" [warning] ");
        Log::operator<<(pLVar3,(char (*) [38])"received a packet other than our dns\n");
        std::__cxx11::string::~string((string *)&local_4c0);
        return;
      }
      iVar2 = HandleData(this,(char *)addr.sin_zero);
      if (iVar2 != 0) {
        pLVar3 = Log::GetInstance();
        pLVar3 = Log::operator<<(pLVar3,yellow);
        Log::FormatTime_abi_cxx11_();
        pLVar3 = Log::operator<<(pLVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&now);
        pLVar3 = Log::operator<<(pLVar3,(char (*) [12])" [warning] ");
        Log::operator<<(pLVar3,(char (*) [20])"resolve dns failed\n");
        std::__cxx11::string::~string((string *)&now);
      }
    }
    else {
      pLVar3 = Log::GetInstance();
      pLVar3 = Log::operator<<(pLVar3,white);
      Log::FormatTime_abi_cxx11_();
      pLVar3 = Log::operator<<(pLVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(recv_data + 0x3f8));
      pLVar3 = Log::operator<<(pLVar3,(char (*) [9])" [info] ");
      Log::operator<<(pLVar3,(char (*) [17])"dns socket error");
      std::__cxx11::string::~string((string *)(recv_data + 0x3f8));
      EventLoop::Remove(this->event_loop_,this->dns_socket_);
      iVar2 = socket(2,2,0x11);
      this->dns_socket_ = iVar2;
      SetNoBlocking(this->dns_socket_);
      EventLoop::Add(this->event_loop_,this->dns_socket_,1,&this->super_ISockNotify);
    }
    tVar4 = time((time_t *)0x0);
    if (0x1d < tVar4 - this->last_time_) {
      LRUCache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Sweep(&this->dns_cache_);
      this->last_time_ = tVar4;
    }
  }
  else {
    pLVar3 = Log::GetInstance();
    pLVar3 = Log::operator<<(pLVar3,red);
    Log::FormatTime_abi_cxx11_();
    pLVar3 = Log::operator<<(pLVar3,&local_38);
    pLVar3 = Log::operator<<(pLVar3,(char (*) [10])" [error] ");
    Log::operator<<(pLVar3,(char (*) [34])"handle event from a error socket\n");
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void DNSResolve::HandleEvent(SOCKET s, int event)
{
    if (s != dns_socket_)
    {
        LOGE << "handle event from a error socket\n";
        return;
    }
    if (event & kPollErr)
    {
        //socket error,create new
        LOGI << "dns socket error";
        event_loop_->Remove(dns_socket_);
        dns_socket_ = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
        SetNoBlocking(dns_socket_);
        event_loop_->Add(dns_socket_, kPollIn, this);
    }
    else
    {
        char recv_data[1024];
        sockaddr_in addr;
        int addr_len = sizeof(sockaddr_in);
        BufferRecvFrom(s, recv_data, 1024, (sockaddr*)&addr, &addr_len);
        //check packet is from our dns server
        bool find = false;
        for (auto& dns_server_addr : servers_)
        {
            if (addr.sin_addr.s_addr ==
                    dns_server_addr.sin_addr.s_addr)
            {
                find = true;
                break;
            }
        }
        if (!find)
        {
            LOGW << "received a packet other than our dns\n";
            return;
        }
        if (0 != HandleData(recv_data))
        {
            LOGW << "resolve dns failed\n";
        }
    }
    time_t now = time(NULL);
    if (now - this->last_time_ >= kCacheSweepInterval)
    {
        dns_cache_.Sweep();
        this->last_time_ = now;
    }
}